

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_cast_operator.hpp
# Opt level: O3

bool duckdb::TrySimpleIntegerCast<int,true>(char *buf,idx_t len,int *result,bool strict)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  byte bVar7;
  ushort uVar8;
  duckdb *pdVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  byte bVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  byte bVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  int16_t local_5a;
  IntegerDecimalCastData<int> local_58;
  ulong local_40;
  ulong local_38;
  
  if (len == 0) {
    return false;
  }
  uVar2 = 0;
  do {
    bVar13 = buf[uVar2];
    if ((4 < bVar13 - 9) && (bVar13 != 0x20)) {
      if (bVar13 == 0x2d) {
        if (len - 1 != uVar2) {
          uVar10 = len - uVar2;
          uVar12 = 1;
          iVar4 = 0;
          goto LAB_014f0dab;
        }
        break;
      }
      if (bVar13 == 0x30 && len - 1 != uVar2) {
        bVar17 = buf[uVar2 + 1];
        if (bVar17 < 0x62) {
          if (bVar17 == 0x42) {
LAB_014f1065:
            uVar10 = ~uVar2 + len;
            if (1 < uVar10) {
              iVar4 = 0;
              uVar12 = 1;
              goto LAB_014f1080;
            }
            break;
          }
          if (bVar17 == 0x58) {
LAB_014f0f4c:
            uVar10 = ~uVar2 + len;
            if (1 < uVar10) {
              iVar4 = 0;
              uVar12 = 1;
              goto LAB_014f0f71;
            }
            break;
          }
        }
        else {
          if (bVar17 == 0x62) goto LAB_014f1065;
          if (bVar17 == 0x78) goto LAB_014f0f4c;
        }
      }
      uVar12 = len - uVar2;
      uVar10 = (ulong)(bVar13 == 0x2b);
      if (uVar12 <= uVar10) {
        iVar4 = 0;
        uVar19 = 1;
        goto LAB_014f1200;
      }
      iVar4 = 0;
      uVar6 = uVar10;
      goto LAB_014f0e95;
    }
    uVar2 = uVar2 + 1;
  } while (len != uVar2);
  goto LAB_014f123d;
  while( true ) {
    uVar14 = (0x80000000 - bVar17) / 10;
    if (SBORROW4(iVar4,-uVar14) != (int)(iVar4 + uVar14) < 0) goto LAB_014f123d;
    iVar4 = iVar4 * 10 - (uint)bVar17;
    uVar19 = uVar10;
    if (~uVar12 + len == uVar2) break;
    if (buf[uVar2 + 1 + uVar12] == '_') {
      if (((len - uVar12) - 2 == uVar2) ||
         (uVar12 = uVar12 + 2, 9 < (byte)(buf[uVar2 + uVar12] - 0x30U))) goto LAB_014f123d;
    }
    else {
      uVar12 = uVar12 + 1;
    }
    uVar19 = uVar12;
    if (uVar10 <= uVar12) break;
LAB_014f0dab:
    bVar13 = buf[uVar2 + uVar12];
    bVar17 = bVar13 - 0x30;
    if (9 < bVar17) {
      uVar6 = uVar12;
      if (bVar13 == 0x2e) {
        uVar6 = uVar12 + 1;
        uVar19 = uVar12;
        if (uVar10 <= uVar6) break;
        if ((uVar12 < 2) || (bVar13 = buf[uVar2 + 1 + uVar12], (byte)(bVar13 - 0x30) < 10))
        goto LAB_014f123d;
      }
      if ((4 < bVar13 - 9) && (bVar13 != 0x20)) goto LAB_014f123d;
      uVar6 = uVar6 + 1;
      uVar19 = uVar6;
      if (uVar6 < uVar10) goto LAB_014f115e;
      break;
    }
  }
  goto joined_r0x014f1218;
  while (uVar6 = uVar6 + 1, uVar19 = uVar10, uVar10 != uVar6) {
LAB_014f115e:
    if ((4 < (byte)buf[uVar2 + uVar6] - 9) && (buf[uVar2 + uVar6] != 0x20)) goto LAB_014f123d;
  }
joined_r0x014f1218:
  if (1 < uVar19) goto LAB_014f1205;
  goto LAB_014f123d;
  while( true ) {
    uVar6 = uVar10;
    if ((len - uVar12) - 2 != uVar2) {
      if (buf[uVar2 + 2 + uVar12] == '_') {
        if (((len - uVar12) - 3 == uVar2) || ((buf[uVar2 + 3 + uVar12] & 0xfeU) != 0x30))
        goto LAB_014f123d;
        uVar6 = uVar12 + 2;
      }
      else {
        uVar6 = uVar12 + 1;
      }
    }
    uVar12 = uVar6;
    if (0x3fffffff < iVar4) goto LAB_014f123d;
    iVar4 = iVar11 + iVar4 * 2;
    if (uVar10 <= uVar12) break;
LAB_014f1080:
    iVar11 = 0;
    if (buf[uVar2 + 1 + uVar12] != '0') {
      if (buf[uVar2 + 1 + uVar12] != '1') goto LAB_014f123d;
      iVar11 = 1;
    }
  }
  goto LAB_014f1205;
  while( true ) {
    uVar12 = uVar6;
    if ((int)(bVar7 >> 4 ^ 0x7ffffff) < iVar4) goto LAB_014f123d;
    iVar4 = iVar4 * 0x10 + (uint)bVar7;
    if (uVar10 <= uVar12) break;
LAB_014f0f71:
    bVar13 = buf[uVar2 + 1 + uVar12];
    bVar17 = bVar13 | 0x20;
    if (0x19 < (byte)(bVar13 + 0xbf)) {
      bVar17 = bVar13;
    }
    bVar13 = bVar17 - 0x30;
    if ((byte)(bVar17 + 0x9f) < 6 || bVar13 < 10) {
      bVar7 = bVar17 + 0xa9;
      if (bVar17 < 0x61) {
        bVar7 = bVar13;
      }
    }
    else {
      bVar7 = bVar13;
      if (5 < (byte)(bVar17 + 0xbf)) goto LAB_014f123d;
    }
    uVar6 = uVar10;
    if ((len - uVar12) - 2 != uVar2) {
      if (buf[uVar2 + 2 + uVar12] == '_') {
        if ((len - uVar12) - 3 == uVar2) goto LAB_014f123d;
        uVar6 = uVar12 + 2;
        if ((9 < (byte)(buf[uVar2 + 3 + uVar12] - 0x30U)) &&
           ((uVar14 = (byte)buf[uVar2 + 3 + uVar12] - 0x41, 0x25 < uVar14 ||
            ((0x3f0000003fU >> ((ulong)uVar14 & 0x3f) & 1) == 0)))) goto LAB_014f123d;
      }
      else {
        uVar6 = uVar12 + 1;
      }
    }
  }
  goto LAB_014f1205;
  while( true ) {
    if ((int)((bVar17 ^ 0x7ffffffe) / 10) < iVar4) goto LAB_014f123d;
    iVar4 = (uint)bVar17 + iVar4 * 10;
    uVar19 = uVar12;
    if (~uVar6 + len == uVar2) break;
    if (buf[uVar2 + 1 + uVar6] == '_') {
      if (((len - uVar6) - 2 == uVar2) ||
         (uVar6 = uVar6 + 2, 9 < (byte)(buf[uVar2 + uVar6] - 0x30U))) goto LAB_014f123d;
    }
    else {
      uVar6 = uVar6 + 1;
    }
    uVar19 = uVar6;
    if (uVar12 <= uVar6) break;
LAB_014f0e95:
    bVar13 = buf[uVar2 + uVar6];
    bVar17 = bVar13 - 0x30;
    if (9 < bVar17) {
      uVar19 = uVar6;
      if (bVar13 == 0x2e) {
        uVar19 = uVar6 + 1;
        if (uVar12 <= uVar19) {
          if (uVar6 <= uVar10) goto LAB_014f123d;
          break;
        }
        if ((uVar6 <= uVar10) || (bVar13 = buf[uVar2 + 1 + uVar6], (byte)(bVar13 - 0x30) < 10))
        goto LAB_014f123d;
      }
      if ((4 < bVar13 - 9) && (bVar13 != 0x20)) goto LAB_014f123d;
      uVar6 = uVar19 + 1;
      uVar19 = uVar6;
      if (uVar6 < uVar12) goto LAB_014f11d8;
      break;
    }
  }
  goto LAB_014f1200;
LAB_014f165a:
  bVar13 = buf[uVar2 + uVar6];
  bVar17 = bVar13 - 0x30;
  local_40 = uVar19;
  if (9 < bVar17) {
    local_58._18_6_ = 0;
    if (uVar6 <= uVar19 && uVar12 < 2) {
      return false;
    }
LAB_014f1869:
    uVar14 = (uint)bVar13;
    if (bVar13 < 0x20) {
      if (4 < uVar14 - 9) {
        return false;
      }
LAB_014f187f:
      uVar6 = uVar6 + 1;
      uVar18 = uVar6;
      if (uVar6 < uVar10) {
        do {
          if ((4 < (byte)buf[uVar2 + uVar6] - 9) && (buf[uVar2 + uVar6] != 0x20)) {
            return false;
          }
          uVar6 = uVar6 + 1;
          uVar18 = uVar10;
        } while (uVar10 != uVar6);
      }
      goto LAB_014f16fa;
    }
    if ((bVar13 != 0x65) && (uVar14 != 0x45)) {
      if (uVar14 != 0x20) {
        return false;
      }
      goto LAB_014f187f;
    }
    if (uVar6 == 1) {
      return false;
    }
    if (uVar10 <= uVar6 + 1) {
      return false;
    }
    local_5a = 0;
    pdVar9 = (duckdb *)(buf + uVar2 + uVar6 + 1);
    pcVar5 = (char *)(~uVar2 + (len - uVar6));
    if (*pdVar9 == (duckdb)0x2d) {
      bVar1 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                        (pdVar9,pcVar5,(idx_t)&local_5a,(IntegerCastData<short> *)pcVar5,bVar1);
    }
    else {
      bVar1 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                        (pdVar9,pcVar5,(idx_t)&local_5a,(IntegerCastData<short> *)pcVar5,bVar1);
    }
    if (bVar1 == false) {
      return false;
    }
    bVar1 = IntegerDecimalCastOperation::HandleExponent<duckdb::IntegerDecimalCastData<int>,true>
                      (&local_58,local_5a);
    goto LAB_014f1606;
  }
  if (local_58.decimal <= (long)(((ulong)bVar17 ^ 0x7ffffffffffffffe) / 10)) {
    local_58.decimal_digits = uVar8 + 1;
    local_58.decimal = (ulong)bVar17 + local_58.decimal * 10;
    uVar8 = local_58.decimal_digits;
  }
  uVar18 = uVar10;
  if (~uVar6 + len != uVar2) goto code_r0x014f16ad;
  goto LAB_014f1919;
code_r0x014f16ad:
  if (buf[uVar2 + 1 + uVar6] == '_') {
    if ((len - uVar6) - 2 == uVar2) {
      return false;
    }
    uVar6 = uVar6 + 2;
    if (9 < (byte)(buf[uVar2 + uVar6] - 0x30U)) {
      return false;
    }
  }
  else {
    uVar6 = uVar6 + 1;
  }
  uVar18 = uVar6;
  if (uVar10 <= uVar6) goto LAB_014f1919;
  goto LAB_014f165a;
LAB_014f1919:
  local_58._18_6_ = 0;
LAB_014f1929:
  if ((uVar12 < 2) && (uVar18 <= uVar19)) {
    return false;
  }
  goto LAB_014f16fa;
LAB_014f174f:
  uVar15 = uVar16;
  bVar13 = buf[uVar2 + uVar19];
  bVar17 = bVar13 - 0x30;
  local_38 = uVar18;
  if (9 < bVar17) {
    local_58._16_8_ = uVar15 & 0xffff;
    if (uVar19 <= uVar18 && uVar6 <= uVar12) {
      return false;
    }
LAB_014f1964:
    uVar14 = (uint)bVar13;
    if (0x1f < bVar13) {
      if ((bVar13 != 0x65) && (uVar14 != 0x45)) {
        if (uVar14 != 0x20) {
          return false;
        }
        goto LAB_014f197a;
      }
      if (uVar19 == uVar12) {
        return false;
      }
      if (uVar10 <= uVar19 + 1) {
        return false;
      }
      local_5a = 0;
      pdVar9 = (duckdb *)(buf + uVar2 + uVar19 + 1);
      pcVar5 = (char *)(~uVar2 + (len - uVar19));
      if (*pdVar9 == (duckdb)0x2d) {
        bVar1 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                          (pdVar9,pcVar5,(idx_t)&local_5a,(IntegerCastData<short> *)pcVar5,bVar1);
      }
      else {
        bVar1 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                          (pdVar9,pcVar5,(idx_t)&local_5a,(IntegerCastData<short> *)pcVar5,bVar1);
      }
      if (bVar1 == false) {
        return false;
      }
      bVar1 = IntegerDecimalCastOperation::HandleExponent<duckdb::IntegerDecimalCastData<int>,false>
                        (&local_58,local_5a);
      goto LAB_014f1606;
    }
    if (4 < uVar14 - 9) {
      return false;
    }
LAB_014f197a:
    uVar19 = uVar19 + 1;
    uVar20 = uVar19;
    if (uVar19 < uVar10) {
      do {
        if ((4 < (byte)buf[uVar2 + uVar19] - 9) && (buf[uVar2 + uVar19] != 0x20)) {
          return false;
        }
        uVar19 = uVar19 + 1;
        uVar20 = uVar10;
      } while (uVar10 != uVar19);
    }
    goto LAB_014f1819;
  }
  uVar16 = uVar15;
  if (local_58.decimal <= (long)(((ulong)bVar17 ^ 0x7ffffffffffffffe) / 10)) {
    uVar14 = uVar14 + 1;
    local_58.decimal = local_58.decimal * 10 + (ulong)bVar17;
    uVar16 = (ulong)uVar14;
  }
  uVar20 = uVar10;
  local_40 = uVar15;
  if (~uVar19 + len != uVar2) goto code_r0x014f17bd;
  goto LAB_014f1a0c;
code_r0x014f17bd:
  if (buf[uVar2 + 1 + uVar19] == '_') {
    if ((len - uVar19) - 2 == uVar2) {
      return false;
    }
    uVar19 = uVar19 + 2;
    if (9 < (byte)(buf[uVar2 + uVar19] - 0x30U)) {
      return false;
    }
  }
  else {
    uVar19 = uVar19 + 1;
  }
  uVar20 = uVar19;
  if (uVar10 <= uVar19) goto LAB_014f1a0c;
  goto LAB_014f174f;
LAB_014f1a0c:
  local_58._16_8_ = uVar16 & 0xffff;
LAB_014f1a1c:
  if ((uVar6 <= uVar12) && (uVar20 <= uVar18)) {
    return false;
  }
  goto LAB_014f1819;
  while (uVar6 = uVar6 + 1, uVar19 = uVar12, uVar12 != uVar6) {
LAB_014f11d8:
    if ((4 < (byte)buf[uVar2 + uVar6] - 9) && (buf[uVar2 + uVar6] != 0x20)) goto LAB_014f123d;
  }
LAB_014f1200:
  if (uVar10 < uVar19) {
LAB_014f1205:
    *result = iVar4;
    return true;
  }
LAB_014f123d:
  uVar2 = 0;
  while ((bVar13 = buf[uVar2], bVar13 - 9 < 5 || (bVar13 == 0x20))) {
    uVar2 = uVar2 + 1;
    if (len == uVar2) {
      return false;
    }
  }
  local_58.result = 0;
  local_58.decimal = 0;
  local_58._16_8_ = 0;
  uVar10 = len - uVar2;
  bVar1 = SUB81(uVar10,0);
  if (bVar13 == 0x2d) {
    if (len - 1 == uVar2) {
      IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<int>,true>(&local_58);
      return false;
    }
    uVar12 = 1;
    local_58.result = 0;
    do {
      bVar13 = buf[uVar2 + uVar12];
      bVar17 = bVar13 - 0x30;
      if (9 < bVar17) {
        uVar6 = uVar12;
        if (bVar13 != 0x2e) goto LAB_014f1869;
        uVar19 = uVar12 + 1;
        uVar18 = uVar19;
        if (uVar10 <= uVar19) goto LAB_014f1929;
        local_58.decimal = 0;
        local_58.decimal_digits = 0;
        uVar8 = 0;
        uVar6 = uVar19;
        goto LAB_014f165a;
      }
      uVar6 = (0x8000000000000000 - (ulong)bVar17) / 10;
      if (SBORROW8(local_58.result,-uVar6) != (long)(local_58.result + uVar6) < 0) {
        return false;
      }
      local_58.result = local_58.result * 10 - (ulong)bVar17;
      uVar18 = uVar10;
      if (~uVar12 + len == uVar2) break;
      if (buf[uVar2 + 1 + uVar12] == '_') {
        if ((len - uVar12) - 2 == uVar2) {
          return false;
        }
        uVar12 = uVar12 + 2;
        if (9 < (byte)(buf[uVar2 + uVar12] - 0x30U)) {
          return false;
        }
      }
      else {
        uVar12 = uVar12 + 1;
      }
      uVar18 = uVar12;
    } while (uVar12 < uVar10);
LAB_014f16fa:
    bVar1 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<int>,true>
                      (&local_58);
    if (!bVar1) {
      return false;
    }
    if (uVar18 < 2) {
      return false;
    }
    goto LAB_014f1838;
  }
  if (bVar13 == 0x30 && len - 1 != uVar2) {
    bVar17 = buf[uVar2 + 1];
    if (bVar17 < 0x62) {
      if (bVar17 == 0x42) {
LAB_014f1569:
        uVar10 = ~uVar2 + len;
        if (uVar10 < 2) goto LAB_014f160f;
        uVar12 = 1;
        local_58.result = 0;
        do {
          lVar3 = 0;
          if (buf[uVar2 + 1 + uVar12] != '0') {
            if (buf[uVar2 + 1 + uVar12] != '1') {
              return false;
            }
            lVar3 = 1;
          }
          uVar6 = uVar10;
          if ((len - uVar12) - 2 != uVar2) {
            if (buf[uVar2 + 2 + uVar12] == '_') {
              if ((len - uVar12) - 3 == uVar2) {
                return false;
              }
              if ((buf[uVar2 + 3 + uVar12] & 0xfeU) != 0x30) {
                return false;
              }
              uVar6 = uVar12 + 2;
            }
            else {
              uVar6 = uVar12 + 1;
            }
          }
          uVar12 = uVar6;
          if (0x3fffffffffffffff < local_58.result) {
            return false;
          }
          local_58.result = lVar3 + local_58.result * 2;
        } while (uVar12 < uVar10);
      }
      else {
        if (bVar17 != 0x58) goto LAB_014f12c9;
LAB_014f1448:
        uVar10 = ~uVar2 + len;
        if (uVar10 < 2) goto LAB_014f160f;
        uVar12 = 1;
        local_58.result = 0;
        do {
          bVar13 = buf[uVar2 + 1 + uVar12];
          bVar17 = bVar13 | 0x20;
          if (0x19 < (byte)(bVar13 + 0xbf)) {
            bVar17 = bVar13;
          }
          bVar13 = bVar17 - 0x30;
          if ((byte)(bVar17 + 0x9f) < 6 || bVar13 < 10) {
            bVar7 = bVar17 + 0xa9;
            if (bVar17 < 0x61) {
              bVar7 = bVar13;
            }
          }
          else {
            bVar7 = bVar13;
            if (5 < (byte)(bVar17 + 0xbf)) {
              return false;
            }
          }
          uVar6 = uVar10;
          if ((len - uVar12) - 2 != uVar2) {
            if (buf[uVar2 + 2 + uVar12] == '_') {
              if ((len - uVar12) - 3 == uVar2) {
                return false;
              }
              uVar6 = uVar12 + 2;
              if (9 < (byte)(buf[uVar2 + 3 + uVar12] - 0x30U)) {
                uVar14 = (byte)buf[uVar2 + 3 + uVar12] - 0x41;
                if (0x25 < uVar14) {
                  return false;
                }
                if ((0x3f0000003fU >> ((ulong)uVar14 & 0x3f) & 1) == 0) {
                  return false;
                }
              }
            }
            else {
              uVar6 = uVar12 + 1;
            }
          }
          uVar12 = uVar6;
          if ((long)((ulong)(bVar7 >> 4) ^ 0x7ffffffffffffff) < local_58.result) {
            return false;
          }
          local_58.result = local_58.result * 0x10 + (ulong)bVar7;
        } while (uVar12 < uVar10);
      }
      bVar1 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<int>,false>
                        (&local_58);
LAB_014f1606:
      if (bVar1 == false) {
        return false;
      }
      goto LAB_014f1838;
    }
    if (bVar17 == 0x62) goto LAB_014f1569;
    if (bVar17 == 0x78) goto LAB_014f1448;
  }
LAB_014f12c9:
  uVar12 = (ulong)(bVar13 == 0x2b);
  if (uVar10 <= uVar12) {
LAB_014f160f:
    IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<int>,false>(&local_58);
    return false;
  }
  local_58.result = 0;
  uVar6 = uVar12;
  do {
    bVar13 = buf[uVar2 + uVar6];
    bVar17 = bVar13 - 0x30;
    if (9 < bVar17) {
      uVar19 = uVar6;
      if (bVar13 != 0x2e) goto LAB_014f1964;
      uVar18 = uVar6 + 1;
      uVar20 = uVar18;
      if (uVar10 <= uVar18) goto LAB_014f1a1c;
      local_58.decimal = 0;
      uVar14 = 0;
      uVar16 = 0;
      uVar19 = uVar18;
      goto LAB_014f174f;
    }
    if ((long)(((ulong)bVar17 ^ 0x7ffffffffffffffe) / 10) < local_58.result) {
      return false;
    }
    local_58.result = local_58.result * 10 + (ulong)bVar17;
    uVar20 = uVar10;
    if (~uVar6 + len == uVar2) break;
    if (buf[uVar2 + 1 + uVar6] == '_') {
      if ((len - uVar6) - 2 == uVar2) {
        return false;
      }
      uVar6 = uVar6 + 2;
      if (9 < (byte)(buf[uVar2 + uVar6] - 0x30U)) {
        return false;
      }
    }
    else {
      uVar6 = uVar6 + 1;
    }
    uVar20 = uVar6;
  } while (uVar6 < uVar10);
LAB_014f1819:
  bVar1 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<int>,false>
                    (&local_58);
  if (!bVar1) {
    return false;
  }
  if (uVar20 <= uVar12) {
    return false;
  }
LAB_014f1838:
  *result = (int)local_58.result;
  return true;
}

Assistant:

static bool TryIntegerCast(const char *buf, idx_t len, T &result, bool strict) {
	// skip any spaces at the start
	while (len > 0 && StringUtil::CharacterIsSpace(*buf)) {
		buf++;
		len--;
	}
	if (len == 0) {
		return false;
	}
	if (ZERO_INITIALIZE) {
		memset(&result, 0, sizeof(T));
	}
	// if the number is negative, we set the negative flag and skip the negative sign
	if (*buf == '-') {
		if (!IS_SIGNED) {
			// Need to check if its not -0
			idx_t pos = 1;
			while (pos < len) {
				if (buf[pos++] != '0') {
					return false;
				}
			}
		}
		return IntegerCastLoop<T, true, ALLOW_EXPONENT, OP, decimal_separator>(buf, len, result, strict);
	}
	if (len > 1 && *buf == '0') {
		if (buf[1] == 'x' || buf[1] == 'X') {
			// If it starts with 0x or 0X, we parse it as a hex value
			buf++;
			len--;
			return IntegerHexCastLoop<T, false, false, OP>(buf, len, result, strict);
		} else if (buf[1] == 'b' || buf[1] == 'B') {
			// If it starts with 0b or 0B, we parse it as a binary value
			buf++;
			len--;
			return IntegerBinaryCastLoop<T, false, false, OP>(buf, len, result, strict);
		} else if (strict && StringUtil::CharacterIsDigit(buf[1])) {
			// leading zeros are not allowed in strict mode
			return false;
		}
	}
	return IntegerCastLoop<T, false, ALLOW_EXPONENT, OP, decimal_separator>(buf, len, result, strict);
}